

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void show_battlefield_open
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                *battle_field)

{
  char cVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  int iVar4;
  bool bVar5;
  allocator local_55;
  int local_54;
  string coordinates;
  
  std::__cxx11::string::string((string *)&coordinates,"A0",&local_55);
  poVar2 = std::operator<<((ostream *)&std::cout,"  A B C D E F G H I J");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"-----------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar4 = 0;
  while (iVar4 != 10) {
    *coordinates._M_dataplus._M_p = 'A';
    local_54 = iVar4;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::operator<<(poVar2,"|");
    iVar4 = 10;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
               ::operator[](battle_field,&coordinates);
      cVar1 = (char)(0x23202b2a20 >> (((byte)*pmVar3 & 7) << 3));
      if (4 < *pmVar3) {
        cVar1 = '&';
      }
      std::operator<<((ostream *)&std::cout,cVar1);
      std::operator<<((ostream *)&std::cout," ");
      *coordinates._M_dataplus._M_p = *coordinates._M_dataplus._M_p + '\x01';
    }
    std::operator<<((ostream *)&std::cout,"|");
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    coordinates._M_dataplus._M_p[1] = coordinates._M_dataplus._M_p[1] + '\x01';
    iVar4 = local_54 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"-----------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&coordinates);
  return;
}

Assistant:

void show_battlefield_open (map <string, unsigned short> battle_field){
    int i=0, j=0;
    string coordinates="A0";
    cout<<"  A B C D E F G H I J"<<endl;
    cout<<"-----------------------"<<endl;
    for(i=0;i<10;i++){
        coordinates[0]='A';
        cout<<i<<"|";
        for(j=0;j<10;j++){
            switch (battle_field[coordinates]) {
                case 0:cout << ' ';break;
                case 1:cout << '*';break;
                case 2:cout << '+';break;
                case 3:cout << ' ';break;
                case 4:cout << '#';break;
                default: cout<<'&';
            }
            cout<<" ";
            coordinates[0]++;
        }
        cout<<"|";
        cout<<endl;
        coordinates[1]++;
    }
    cout<<"-----------------------"<<endl;
}